

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

QHttp2Stream * __thiscall
QHttp2Connection::createStreamInternal_impl(QHttp2Connection *this,quint32 streamID)

{
  byte bVar1;
  Entry *pEVar2;
  Data *pDVar3;
  long lVar4;
  bool bVar5;
  QHttp2Stream *this_00;
  Data *pDVar6;
  uchar *puVar7;
  undefined4 *puVar8;
  void **ppvVar9;
  QWeakPointer<QObject> *other;
  void **ppvVar10;
  QHttp2Stream *pQVar11;
  long in_FS_OFFSET;
  QObject local_78 [12];
  quint32 streamID_local;
  code *local_68;
  undefined8 local_60;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  streamID_local = streamID;
  if (((*(int *)(this + 0x10) != 0) || (this[0x2b0] != (QHttp2Connection)0x0)) ||
     (bVar5 = sendClientPreface(this), bVar5)) {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (code *)0x0;
    QHash<unsigned_int,QPointer<QHttp2Stream>>::
    tryEmplace_impl<unsigned_int_const&,decltype(nullptr)>
              ((TryEmplaceResult *)local_58,this + 0x1c0,&streamID_local,&local_68);
    if (local_58[0x10] == true) {
      pEVar2 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
      bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
              [(uint)local_58._8_8_ & 0x7f];
      other = (QWeakPointer<QObject> *)(pEVar2[bVar1].storage.data + 8);
      this_00 = (QHttp2Stream *)operator_new(0x90);
      QHttp2Stream::QHttp2Stream(this_00,(QHttp2Connection *)this,streamID_local);
      pDVar6 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_00);
      pDVar3 = other->d;
      other->d = pDVar6;
      other->value = (QObject *)this_00;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(pDVar3);
        }
        pDVar6 = other->d;
      }
      puVar7 = pEVar2[bVar1].storage.data + 0x10;
      if (pDVar6 == (Data *)0x0) {
        _DAT_00000018 = *(undefined4 *)(this + 0x2a0);
        ppvVar10 = *(void ***)puVar7;
        ppvVar9 = (void **)0x0;
        _DAT_00000014 = *(undefined4 *)(this + 0x298);
      }
      else {
        ppvVar10 = *(void ***)puVar7;
        *(undefined4 *)((long)ppvVar10 + 0x14) = *(undefined4 *)(this + 0x298);
        *(undefined4 *)(ppvVar10 + 3) = *(undefined4 *)(this + 0x2a0);
        ppvVar9 = (void **)0x0;
        if ((pDVar6->strongref)._q_value.super___atomic_base<int>._M_i != 0) {
          ppvVar9 = ppvVar10;
        }
        LOCK();
        (pDVar6->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar6->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_68 = QHttp2Stream::uploadBlocked;
      pQVar11 = (QHttp2Stream *)0x0;
      local_60 = 0;
      puVar8 = (undefined4 *)operator_new(0x28);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qhttp2connection.cpp:934:57),_QtPrivate::List<>,_void>
           ::impl;
      *(QHttp2Connection **)(puVar8 + 4) = this;
      *(Data **)(puVar8 + 6) = pDVar6;
      *(void ***)(puVar8 + 8) = ppvVar10;
      QObject::connectImpl
                (local_78,ppvVar9,(QObject *)&local_68,(void **)this,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_78);
      QWeakPointer<QObject>::operator=
                ((QWeakPointer<QObject> *)
                 ((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
                  [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
                   [(uint)local_58._8_8_ & 0x7f]].storage.data + 8),other);
      pEVar2 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
      bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
              [(uint)local_58._8_8_ & 0x7f];
      lVar4 = *(long *)(pEVar2[bVar1].storage.data + 8);
      if (lVar4 == 0) goto LAB_001e8a3b;
      if (*(int *)(lVar4 + 4) != 0) {
        pQVar11 = *(QHttp2Stream **)(pEVar2[bVar1].storage.data + 0x10);
        goto LAB_001e8a3b;
      }
    }
  }
  else {
    qHttp2ConnectionLog();
    if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      createStreamInternal_impl(this);
    }
  }
  pQVar11 = (QHttp2Stream *)0x0;
LAB_001e8a3b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar11;
}

Assistant:

QHttp2Stream *QHttp2Connection::createStreamInternal_impl(quint32 streamID)
{
    Q_ASSERT(streamID > m_lastIncomingStreamID || streamID >= m_nextStreamID);

    if (m_connectionType == Type::Client && !m_prefaceSent && !sendClientPreface()) {
        qCWarning(qHttp2ConnectionLog, "[%p] Failed to send client preface", this);
        return nullptr;
    }

    auto result = m_streams.tryEmplace(streamID, nullptr);
    if (!result.inserted)
        return nullptr;
    QPointer<QHttp2Stream> &stream = result.iterator.value();
    stream = new QHttp2Stream(this, streamID);
    stream->m_recvWindow = streamInitialReceiveWindowSize;
    stream->m_sendWindow = streamInitialSendWindowSize;

    connect(stream, &QHttp2Stream::uploadBlocked, this, [this, stream] {
        m_blockedStreams.insert(stream->streamID());
    });
    *result.iterator = stream;
    return *result.iterator;
}